

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>
::
ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat,serialize_tests::BaseFormat>
          (ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>
           *this,UncopyableStream *s,BaseFormat *params1,BaseFormat *params2)

{
  long in_FS_OFFSET;
  ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat> local_38;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.m_substream.super_DataStream.vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (s->super_DataStream).vch.
       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.m_substream.super_DataStream.vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (s->super_DataStream).vch.
       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.m_substream.super_DataStream.vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (s->super_DataStream).vch.
       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (s->super_DataStream).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (s->super_DataStream).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (s->super_DataStream).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.m_substream.super_DataStream.m_read_pos = (s->super_DataStream).m_read_pos;
  *(BaseFormat **)this = params1;
  local_38.m_params = params2;
  ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>::ParamsStream
            ((ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat> *)
             (this + 8),&local_38);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_38.m_substream
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ParamsStream(NestedSubstream&& s, const Params1& params1 LIFETIMEBOUND, const Params2& params2 LIFETIMEBOUND, const NestedParams&... params LIFETIMEBOUND)
        : ParamsStream{::ParamsStream{std::forward<NestedSubstream>(s), params2, params...}, params1} {}